

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_hqresize.cpp
# Opt level: O0

void scale3x(uint32 *input,uint32 *output,size_t width,size_t height)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  long lVar9;
  uint32 local_c0;
  uint32 local_bc;
  uint32 local_b8;
  uint32 local_b4;
  uint32 local_b0;
  uint32 local_ac;
  uint32 local_a8;
  uint32 local_a4;
  size_t local_a0;
  long local_98;
  int local_90;
  int local_88;
  uint32 I;
  uint32 H;
  uint32 G;
  uint32 F;
  uint32 E;
  uint32 D;
  uint32 C;
  uint32 B;
  uint32 A;
  size_t jPlus;
  size_t jMinus;
  size_t j;
  int iPlus;
  int iMinus;
  size_t i;
  size_t scaledWidth;
  size_t height_local;
  size_t width_local;
  uint32 *output_local;
  uint32 *input_local;
  
  lVar9 = width * 3;
  for (_iPlus = 0; _iPlus < width; _iPlus = _iPlus + 1) {
    local_90 = (int)_iPlus;
    if (_iPlus == 0) {
      local_88 = 0;
    }
    else {
      local_88 = local_90 + -1;
    }
    if (_iPlus < width - 1) {
      local_90 = local_90 + 1;
    }
    for (jMinus = 0; jMinus < height; jMinus = jMinus + 1) {
      if (jMinus == 0) {
        local_98 = 0;
      }
      else {
        local_98 = jMinus - 1;
      }
      if (jMinus < height - 1) {
        local_a0 = jMinus + 1;
      }
      else {
        local_a0 = jMinus;
      }
      uVar1 = input[(long)local_88 + width * local_98];
      uVar2 = input[(long)local_88 + width * jMinus];
      uVar3 = input[(long)local_88 + width * local_a0];
      uVar4 = input[_iPlus + width * local_98];
      local_c0 = input[_iPlus + width * jMinus];
      uVar5 = input[_iPlus + width * local_a0];
      uVar6 = input[(long)local_90 + width * local_98];
      uVar7 = input[(long)local_90 + width * jMinus];
      uVar8 = input[(long)local_90 + width * local_a0];
      if ((uVar2 == uVar7) || (uVar4 == uVar5)) {
        output[_iPlus * 3 + width * 9 * jMinus] = local_c0;
        output[_iPlus * 3 + lVar9 * (jMinus * 3 + 1)] = local_c0;
        output[_iPlus * 3 + lVar9 * (jMinus * 3 + 2)] = local_c0;
        output[_iPlus * 3 + 1 + width * 9 * jMinus] = local_c0;
        output[_iPlus * 3 + 1 + lVar9 * (jMinus * 3 + 1)] = local_c0;
        output[_iPlus * 3 + 1 + lVar9 * (jMinus * 3 + 2)] = local_c0;
        output[_iPlus * 3 + 2 + width * 9 * jMinus] = local_c0;
        output[_iPlus * 3 + 2 + lVar9 * (jMinus * 3 + 1)] = local_c0;
        output[_iPlus * 3 + 2 + lVar9 * (jMinus * 3 + 2)] = local_c0;
      }
      else {
        local_a4 = local_c0;
        if (uVar4 == uVar2) {
          local_a4 = uVar4;
        }
        output[_iPlus * 3 + width * 9 * jMinus] = local_a4;
        local_a8 = uVar2;
        if (((uVar4 != uVar2) || (local_c0 == uVar3)) && ((uVar2 != uVar5 || (local_c0 == uVar1))))
        {
          local_a8 = local_c0;
        }
        output[_iPlus * 3 + lVar9 * (jMinus * 3 + 1)] = local_a8;
        local_ac = local_c0;
        if (uVar2 == uVar5) {
          local_ac = uVar5;
        }
        output[_iPlus * 3 + lVar9 * (jMinus * 3 + 2)] = local_ac;
        local_b0 = uVar4;
        if (((uVar4 != uVar2) || (local_c0 == uVar6)) && ((uVar4 != uVar7 || (local_c0 == uVar1))))
        {
          local_b0 = local_c0;
        }
        output[_iPlus * 3 + 1 + width * 9 * jMinus] = local_b0;
        output[_iPlus * 3 + 1 + lVar9 * (jMinus * 3 + 1)] = local_c0;
        local_b4 = uVar5;
        if (((uVar2 != uVar5) || (local_c0 == uVar8)) && ((uVar7 != uVar5 || (local_c0 == uVar3))))
        {
          local_b4 = local_c0;
        }
        output[_iPlus * 3 + 1 + lVar9 * (jMinus * 3 + 2)] = local_b4;
        local_b8 = local_c0;
        if (uVar4 == uVar7) {
          local_b8 = uVar4;
        }
        output[_iPlus * 3 + 2 + width * 9 * jMinus] = local_b8;
        local_bc = uVar7;
        if (((uVar4 != uVar7) || (local_c0 == uVar8)) && ((uVar7 != uVar5 || (local_c0 == uVar6))))
        {
          local_bc = local_c0;
        }
        output[_iPlus * 3 + 2 + lVar9 * (jMinus * 3 + 1)] = local_bc;
        if (uVar7 == uVar5) {
          local_c0 = uVar5;
        }
        output[_iPlus * 3 + 2 + lVar9 * (jMinus * 3 + 2)] = local_c0;
      }
    }
  }
  return;
}

Assistant:

static void scale3x(uint32* const input, uint32* const output, const size_t width, const size_t height)
{
	const size_t scaledWidth = 3 * width;

	for (size_t i = 0; i < width; ++i)
	{
		const int iMinus = (i > 0        ) ? (i - 1) : 0;
		const int iPlus  = (i < width - 1) ? (i + 1) : i;

		for (size_t j = 0; j < height; ++j)
		{
			const size_t jMinus = (j > 0          ) ? (j - 1) : 0;
			const size_t jPlus  = (j < height - 1 ) ? (j + 1) : j;

			const uint32 A = input[iMinus + width * jMinus];
			const uint32 B = input[iMinus + width * j     ];
			const uint32 C = input[iMinus + width * jPlus ];
			const uint32 D = input[i      + width * jMinus];
			const uint32 E = input[i      + width * j     ];
			const uint32 F = input[i      + width * jPlus ];
			const uint32 G = input[iPlus  + width * jMinus];
			const uint32 H = input[iPlus  + width * j     ];
			const uint32 I = input[iPlus  + width * jPlus ];

			if (B != H && D != F)
			{
				output[3 * i     + scaledWidth *  3 * j     ] = D == B ? D : E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = (D == B && E != C) || (B == F && E != A) ? B : E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = B == F ? F : E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = (D == B && E != G) || (D == H && E != A) ? D : E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = (B == F && E != I) || (H == F && E != C) ? F : E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = D == H ? D : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = (D == H && E != I) || (H == F && E != G) ? H : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = H == F ? F : E;
			}                                       
			else
			{
				output[3 * i     + scaledWidth *  3 * j     ] = E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = E;
			}
		}
	}
}